

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O2

bool __thiscall
Centaurus::DFA<char>::run
          (DFA<char> *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq,
          int index,int input_pos)

{
  pointer pNVar1;
  bool bVar2;
  byte bVar3;
  pointer pNVar5;
  pointer pDVar4;
  
  pDVar4 = (this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start + index;
  if (seq->_M_string_length == (long)input_pos) {
    bVar3 = pDVar4->m_accept;
  }
  else {
    pNVar1 = *(pointer *)
              ((long)&(pDVar4->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions.
                      super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              + 8);
    for (pNVar5 = (pDVar4->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions.
                  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar3 = (byte)pDVar4, pNVar5 != pNVar1;
        pNVar5 = pNVar5 + 1) {
      bVar2 = CharClass<char>::includes(&pNVar5->m_label,(seq->_M_dataplus)._M_p[input_pos]);
      pDVar4 = (pointer)(ulong)bVar2;
      if (bVar2) {
        bVar3 = run(this,seq,pNVar5->m_dest,input_pos + 1);
        break;
      }
    }
    bVar3 = pNVar5 != pNVar1 & bVar3;
  }
  return (bool)bVar3;
}

Assistant:

bool run(const std::basic_string<TCHAR>& seq, int index = 0, int input_pos = 0) const
	{
		const DFAState<TCHAR>& state = m_states[index];
		if (input_pos == seq.size())
		{
			return state.is_accept();
		}
		else
		{
			for (const auto& tr : state.get_transitions())
			{
				if (tr.label().includes(seq[input_pos]))
				{
					return run(seq, tr.dest(), input_pos + 1);
				}
			}
			return false;
		}
	}